

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpatialInertia.cpp
# Opt level: O1

void __thiscall
iDynTree::SpatialInertia::fromRotationalInertiaWrtCenterOfMass
          (SpatialInertia *this,double mass,Position *com,RotationalInertia *rotInertiaWrtCom)

{
  double dVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  double dVar5;
  long lVar6;
  ActualDstType actualDst;
  PointerType ptr;
  undefined1 auVar7 [16];
  Vector3d local_88;
  undefined1 local_68 [16];
  undefined1 local_58 [16];
  undefined1 local_48 [16];
  undefined1 local_38 [16];
  double local_28;
  
  this->m_mass = mass;
  lVar6 = 1;
  do {
    this->m_mcom[lVar6 + -1] = (com->super_Vector3).m_data[lVar6 + -1] * mass;
    lVar6 = lVar6 + 1;
  } while (lVar6 != 4);
  if (mass == 0.0) {
    dVar1 = (rotInertiaWrtCom->super_Matrix3x3).m_data[1];
    (this->m_rotInertia).super_Matrix3x3.m_data[0] = (rotInertiaWrtCom->super_Matrix3x3).m_data[0];
    (this->m_rotInertia).super_Matrix3x3.m_data[1] = dVar1;
    dVar1 = (rotInertiaWrtCom->super_Matrix3x3).m_data[3];
    (this->m_rotInertia).super_Matrix3x3.m_data[2] = (rotInertiaWrtCom->super_Matrix3x3).m_data[2];
    (this->m_rotInertia).super_Matrix3x3.m_data[3] = dVar1;
    dVar1 = (rotInertiaWrtCom->super_Matrix3x3).m_data[5];
    (this->m_rotInertia).super_Matrix3x3.m_data[4] = (rotInertiaWrtCom->super_Matrix3x3).m_data[4];
    (this->m_rotInertia).super_Matrix3x3.m_data[5] = dVar1;
    dVar1 = (rotInertiaWrtCom->super_Matrix3x3).m_data[7];
    (this->m_rotInertia).super_Matrix3x3.m_data[6] = (rotInertiaWrtCom->super_Matrix3x3).m_data[6];
    (this->m_rotInertia).super_Matrix3x3.m_data[7] = dVar1;
    (this->m_rotInertia).super_Matrix3x3.m_data[8] = (rotInertiaWrtCom->super_Matrix3x3).m_data[8];
  }
  else {
    local_88.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0]
         = this->m_mcom[0];
    local_88.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[1]
         = this->m_mcom[1];
    local_88.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2]
         = this->m_mcom[2];
    squareCrossProductMatrix(&local_88);
    dVar1 = this->m_mass;
    dVar5 = (rotInertiaWrtCom->super_Matrix3x3).m_data[1];
    auVar7._8_8_ = dVar1;
    auVar7._0_8_ = dVar1;
    auVar7 = divpd(local_68,auVar7);
    (this->m_rotInertia).super_Matrix3x3.m_data[0] =
         (rotInertiaWrtCom->super_Matrix3x3).m_data[0] - auVar7._0_8_;
    (this->m_rotInertia).super_Matrix3x3.m_data[1] = dVar5 - auVar7._8_8_;
    dVar5 = (rotInertiaWrtCom->super_Matrix3x3).m_data[3];
    auVar2._8_8_ = dVar1;
    auVar2._0_8_ = dVar1;
    auVar7 = divpd(local_58,auVar2);
    (this->m_rotInertia).super_Matrix3x3.m_data[2] =
         (rotInertiaWrtCom->super_Matrix3x3).m_data[2] - auVar7._0_8_;
    (this->m_rotInertia).super_Matrix3x3.m_data[3] = dVar5 - auVar7._8_8_;
    dVar5 = (rotInertiaWrtCom->super_Matrix3x3).m_data[5];
    auVar3._8_8_ = dVar1;
    auVar3._0_8_ = dVar1;
    auVar7 = divpd(local_48,auVar3);
    (this->m_rotInertia).super_Matrix3x3.m_data[4] =
         (rotInertiaWrtCom->super_Matrix3x3).m_data[4] - auVar7._0_8_;
    (this->m_rotInertia).super_Matrix3x3.m_data[5] = dVar5 - auVar7._8_8_;
    dVar5 = (rotInertiaWrtCom->super_Matrix3x3).m_data[7];
    auVar4._8_8_ = dVar1;
    auVar4._0_8_ = dVar1;
    auVar7 = divpd(local_38,auVar4);
    (this->m_rotInertia).super_Matrix3x3.m_data[6] =
         (rotInertiaWrtCom->super_Matrix3x3).m_data[6] - auVar7._0_8_;
    (this->m_rotInertia).super_Matrix3x3.m_data[7] = dVar5 - auVar7._8_8_;
    (this->m_rotInertia).super_Matrix3x3.m_data[8] =
         (rotInertiaWrtCom->super_Matrix3x3).m_data[8] - local_28 / dVar1;
  }
  return;
}

Assistant:

void SpatialInertia::fromRotationalInertiaWrtCenterOfMass(const double mass,
                                                        const Position& com,
                                                        const RotationalInertia& rotInertiaWrtCom)
{
    this->m_mass = mass;

    for(int i = 0; i < 3; i++ )
    {
        this->m_mcom[i] = this->m_mass*com(i);
    }

    // Here we need to compute the rotational inertia at the com
    // given the one expressed at the frame origin
    // we apply formula 2.63 in Featherstone 2008
    Eigen::Map<Eigen::Matrix3d> linkInertia(this->m_rotInertia.data());
    Eigen::Map<const Eigen::Matrix3d> comInertia(rotInertiaWrtCom.data());
    Eigen::Map<const Eigen::Vector3d> mcom(this->m_mcom);

    if( fabs(this->m_mass) > 0)
    {
        linkInertia = comInertia - squareCrossProductMatrix(mcom)/this->m_mass;
    }
    else
    {
        linkInertia = comInertia;
    }
}